

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

uint32_t __thiscall jrtplib::RTCPSDESPacket::GetChunkSSRC(RTCPSDESPacket *this)

{
  uint32_t *ssrc;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = ntohl(*(uint32_t *)this->currentchunk);
  }
  return this_local._4_4_;
}

Assistant:

inline uint32_t RTCPSDESPacket::GetChunkSSRC() const
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	uint32_t *ssrc = (uint32_t *)currentchunk;
	return ntohl(*ssrc);
}